

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O2

PerThreadSynch * absl::Skip(PerThreadSynch *x)

{
  PerThreadSynch *pPVar1;
  PerThreadSynch *pPVar2;
  PerThreadSynch *pPVar3;
  PerThreadSynch *x1;
  
  pPVar1 = x->skip;
  pPVar3 = x;
  if (x->skip == (PerThreadSynch *)0x0) {
    return x;
  }
  while (pPVar2 = pPVar1, pPVar1 = pPVar2->skip, pPVar1 != (PerThreadSynch *)0x0) {
    pPVar3->skip = pPVar1;
    pPVar3 = pPVar2;
  }
  x->skip = pPVar2;
  return pPVar2;
}

Assistant:

static PerThreadSynch *Skip(PerThreadSynch *x) {
  PerThreadSynch *x0 = nullptr;
  PerThreadSynch *x1 = x;
  PerThreadSynch *x2 = x->skip;
  if (x2 != nullptr) {
    // Each iteration attempts to advance sequence (x0,x1,x2) to next sequence
    // such that   x1 == x0->skip && x2 == x1->skip
    while ((x0 = x1, x1 = x2, x2 = x2->skip) != nullptr) {
      x0->skip = x2;      // short-circuit skip from x0 to x2
    }
    x->skip = x1;         // short-circuit skip from x to result
  }
  return x1;
}